

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double fisk_variance(double param_1,double b,double c)

{
  double theta;
  double dVar1;
  double dVar2;
  
  if (2.0 < c) {
    theta = 3.141592653589793 / c;
    dVar1 = r8_csc(theta + theta);
    dVar2 = r8_csc(theta);
    return (dVar1 * (theta + theta) - dVar2 * theta * dVar2 * theta) * b * b;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"FISK_VARIANCE - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  No variance defined for C <= 2.0\n");
  exit(1);
}

Assistant:

double fisk_variance ( double  /*a*/, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    FISK_VARIANCE returns the variance of the Fisk PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0.0 < B,
//    0.0 < C.
//
//    Output, double FISK_VARIANCE, the variance of the PDF.
//
{
  double g;
  const double r8_pi = 3.14159265358979323;
  double variance;

  if ( c <= 2.0 )
  {
    cerr << " \n";
    cerr << "FISK_VARIANCE - Fatal error!\n";
    cerr << "  No variance defined for C <= 2.0\n";
    exit ( 1 );
  }

  g = r8_pi / c;

  variance = b * b * ( 2.0 * g * r8_csc ( 2.0 * g ) 
    - pow ( ( g * r8_csc ( g ) ), 2 ) );

  return variance;
}